

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btreeblock_test.cc
# Opt level: O3

int load_test_next_kv(void **key_out,void **val_out,void *aux)

{
  sprintf(load_test_next_kv::kk,"k%07lu",*aux);
  sprintf(load_test_next_kv::vv,"v%07lu",*aux);
  *(long *)aux = *aux + 1;
  *key_out = load_test_next_kv::kk;
  *val_out = load_test_next_kv::vv;
  return 0;
}

Assistant:

int load_test_next_kv(void** key_out, void** val_out, void* aux) {
    uint64_t* idx = (uint64_t*)aux;
    static char kk[16];
    static char vv[16];
    sprintf(kk, "k%07lu", *idx);
    sprintf(vv, "v%07lu", *idx);
    (*idx)++;
    *key_out = (void*)kk;
    *val_out = (void*)vv;
    return 0;
}